

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O0

void duckdb::ConvertDecimal<int*>
               (int *src_ptr,Vector *vector,ArrowArray *array,idx_t size,int64_t nested_offset,
               uint64_t parent_offset,ArrowScanLocalState *scan_state,ValidityMask *val_mask,
               DecimalBitWidth arrow_bit_width)

{
  PhysicalType PVar1;
  bool bVar2;
  LogicalType *pLVar3;
  uchar *puVar4;
  idx_t iVar5;
  idx_t iVar6;
  undefined8 uVar7;
  ulong in_RCX;
  ArrowArray *in_RDX;
  Vector *in_RSI;
  char in_stack_00000018;
  bool result_3;
  idx_t row_3;
  hugeint_t *tgt_ptr_3;
  bool result_2;
  idx_t row_2;
  long *tgt_ptr_2;
  bool result_1;
  idx_t row_1;
  int *tgt_ptr_1;
  bool result;
  idx_t row;
  short *tgt_ptr;
  ArrowScanLocalState *in_stack_fffffffffffffe98;
  idx_t in_stack_fffffffffffffea0;
  ArrowArray *in_stack_fffffffffffffea8;
  allocator *paVar8;
  undefined8 in_stack_fffffffffffffee8;
  PhysicalType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  Vector *vector_00;
  string *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 uVar9;
  allocator local_b1;
  string local_b0 [39];
  undefined1 local_89;
  ulong local_88;
  hugeint_t *local_80;
  PhysicalType in_stack_ffffffffffffff8f;
  ulong local_70;
  ulong local_58;
  ulong local_40;
  
  type = (PhysicalType)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  pLVar3 = Vector::GetType(in_RSI);
  PVar1 = LogicalType::InternalType(pLVar3);
  if (PVar1 == INT128) {
    if (in_stack_00000018 == '\x02') {
      puVar4 = ArrowBufferData<unsigned_char>(in_RDX,1);
      pLVar3 = Vector::GetType(in_RSI);
      LogicalType::InternalType(pLVar3);
      iVar5 = GetTypeIdSize(type);
      NumericCast<long,unsigned_long,void>(0x14b06d8);
      iVar6 = GetEffectiveOffset(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                 in_stack_fffffffffffffe98,0x14b06f5);
      FlatVector::SetData(in_RSI,puVar4 + iVar5 * iVar6);
    }
    else {
      local_80 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x14b0725);
      for (local_88 = 0; local_88 < in_RCX; local_88 = local_88 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffea8,
                           in_stack_fffffffffffffea0);
        if (bVar2) {
          local_89 = TryCast::Operation<int,duckdb::hugeint_t>
                               ((int32_t)(in_stack_fffffffffffffea0 >> 0x20),
                                (hugeint_t *)in_stack_fffffffffffffe98,false);
        }
      }
    }
  }
  else if (PVar1 == INT16) {
    FlatVector::GetData<short>((Vector *)0x14b0329);
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
      if (bVar2) {
        TryCast::Operation<int,short>
                  ((int32_t)(in_stack_fffffffffffffea0 >> 0x20),(int16_t *)in_stack_fffffffffffffe98
                   ,false);
      }
    }
  }
  else if (PVar1 == INT32) {
    if (in_stack_00000018 == '\0') {
      vector_00 = in_RSI;
      puVar4 = ArrowBufferData<unsigned_char>(in_RDX,1);
      pLVar3 = Vector::GetType(in_RSI);
      LogicalType::InternalType(pLVar3);
      iVar5 = GetTypeIdSize(type);
      NumericCast<long,unsigned_long,void>(0x14b042e);
      iVar6 = GetEffectiveOffset(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                 in_stack_fffffffffffffe98,0x14b044b);
      FlatVector::SetData(vector_00,puVar4 + iVar5 * iVar6);
    }
    else {
      FlatVector::GetData<int>((Vector *)0x14b047b);
      for (local_58 = 0; local_58 < in_RCX; local_58 = local_58 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffea8,
                           in_stack_fffffffffffffea0);
        if (bVar2) {
          TryCast::Operation<int,int>
                    ((int32_t)(in_stack_fffffffffffffea0 >> 0x20),
                     (int32_t *)in_stack_fffffffffffffe98,false);
        }
      }
    }
  }
  else {
    if (PVar1 != INT64) {
      uVar9 = 1;
      uVar7 = __cxa_allocate_exception(0x10);
      paVar8 = &local_b1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b0,"Unsupported physical type for Decimal: %s",paVar8);
      pLVar3 = Vector::GetType(in_RSI);
      LogicalType::InternalType(pLVar3);
      TypeIdToString_abi_cxx11_(in_stack_ffffffffffffff8f);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                ((NotImplementedException *)
                 CONCAT17(uVar9,CONCAT16(PVar1,in_stack_ffffffffffffff10)),in_stack_ffffffffffffff08
                 ,in_stack_ffffffffffffff00);
      __cxa_throw(uVar7,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
    if (in_stack_00000018 == '\x01') {
      puVar4 = ArrowBufferData<unsigned_char>(in_RDX,1);
      pLVar3 = Vector::GetType(in_RSI);
      LogicalType::InternalType(pLVar3);
      iVar5 = GetTypeIdSize(type);
      NumericCast<long,unsigned_long,void>(0x14b0583);
      iVar6 = GetEffectiveOffset(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                 in_stack_fffffffffffffe98,0x14b05a0);
      FlatVector::SetData(in_RSI,puVar4 + iVar5 * iVar6);
    }
    else {
      FlatVector::GetData<long>((Vector *)0x14b05d0);
      for (local_70 = 0; local_70 < in_RCX; local_70 = local_70 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffea8,
                           in_stack_fffffffffffffea0);
        if (bVar2) {
          TryCast::Operation<int,long>
                    ((int32_t)(in_stack_fffffffffffffea0 >> 0x20),
                     (int64_t *)in_stack_fffffffffffffe98,false);
        }
      }
    }
  }
  return;
}

Assistant:

void ConvertDecimal(SRC src_ptr, Vector &vector, ArrowArray &array, idx_t size, int64_t nested_offset,
                    uint64_t parent_offset, ArrowScanLocalState &scan_state, ValidityMask &val_mask,
                    DecimalBitWidth arrow_bit_width) {

	switch (vector.GetType().InternalType()) {
	case PhysicalType::INT16: {
		auto tgt_ptr = FlatVector::GetData<int16_t>(vector);
		for (idx_t row = 0; row < size; row++) {
			if (val_mask.RowIsValid(row)) {
				auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
				D_ASSERT(result);
				(void)result;
			}
		}
		break;
	}
	case PhysicalType::INT32: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_32) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int32_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT64: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_64) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int64_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT128: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_128) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<hugeint_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}

		break;
	}
	default:
		throw NotImplementedException("Unsupported physical type for Decimal: %s",
		                              TypeIdToString(vector.GetType().InternalType()));
	}
}